

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O1

bool qt_try_modal(QWidget *widget,Type type)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  QWidget **rettop;
  long in_FS_OFFSET;
  QWidget *top;
  QWidget *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  rettop = &local_20;
  local_20 = (QWidget *)0x0;
  bVar1 = QApplicationPrivate::tryModalHelper(widget,rettop);
  bVar3 = true;
  if (!bVar1) {
    bVar2 = 0xecU >> ((byte)type & 0x1f) & type < FocusIn;
    if (((local_20 != (QWidget *)0x0 & bVar2) == 1) &&
       (*(long *)(*(long *)&local_20->field_0x8 + 0x10) == 0)) {
      QWidget::raise(local_20,(int)rettop);
    }
    bVar3 = (bool)(bVar2 ^ 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool qt_try_modal(QWidget *widget, QEvent::Type type)
{
    QWidget * top = nullptr;

    if (QApplicationPrivate::tryModalHelper(widget, &top))
        return true;

    bool block_event  = false;

    switch (type) {
    case QEvent::MouseButtonPress:                        // disallow mouse/key events
    case QEvent::MouseButtonRelease:
    case QEvent::MouseMove:
    case QEvent::KeyPress:
    case QEvent::KeyRelease:
        block_event         = true;
        break;
    default:
        break;
    }

    if (block_event && top && top->parentWidget() == nullptr)
        top->raise();

    return !block_event;
}